

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

CATNDepartureSet<wchar_t> * __thiscall
Centaurus::CompositeATN<wchar_t>::build_departure_set
          (CATNDepartureSet<wchar_t> *__return_storage_ptr__,CompositeATN<wchar_t> *this,
          CATNClosure *closure)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  CATNDepartureSetFactory<wchar_t> deptset_factory;
  ATNStateStack stack;
  CATNDepartureSetFactory<wchar_t> local_70;
  ATNStateStack local_50;
  
  local_70._vptr_CATNDepartureSetFactory = (_func_int **)&PTR__CATNDepartureSetFactory_001a0400;
  local_70.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.m_departures.
  super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019fa40;
  p_Var1 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(closure->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      build_departure_set_r
                (this,&local_70,(ATNPath *)(p_Var1 + 1),p_Var1[2]._M_color,
                 (PriorityChain *)&p_Var1[2]._M_parent,&local_50);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  CATNDepartureSetFactory<wchar_t>::build_departure_set(__return_storage_ptr__,&local_70);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_50.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           );
  local_70._vptr_CATNDepartureSetFactory = (_func_int **)&PTR__CATNDepartureSetFactory_001a0400;
  std::
  vector<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>::
  ~vector(&local_70.m_departures);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set(const CATNClosure& closure) const
    {
        CATNDepartureSetFactory<TCHAR> deptset_factory;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_departure_set_r(deptset_factory, p.path(), p.color(), p.priority(), stack);
        }

        return deptset_factory.build_departure_set();
    }